

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_dapi.cpp
# Opt level: O0

void tqapi_dapi_free_get_bars_result(DataApi *dapi,GetBarResult *result)

{
  GetBarResultData *this;
  GetBarResult *result_local;
  DataApi *dapi_local;
  
  if (result != (GetBarResult *)0x0) {
    this = result->data;
    if (this != (GetBarResultData *)0x0) {
      GetBarResultData::~GetBarResultData(this);
      operator_delete(this);
    }
    if (result != (GetBarResult *)0x0) {
      operator_delete(result);
    }
  }
  return;
}

Assistant:

void tqapi_dapi_free_get_bars_result(DataApi* dapi, GetBarResult* result)
    {
        if (result) {
            delete result->data;
            delete result;
        }
    }